

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O3

int str_sub(lua_State *L)

{
  size_t in_RAX;
  char *pcVar1;
  lua_Integer lVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  size_t l;
  size_t local_28;
  
  local_28 = in_RAX;
  pcVar1 = luaL_checklstring(L,1,&local_28);
  lVar2 = luaL_checkinteger(L,2);
  lVar6 = (lVar2 >> 0x3f & local_28 + 1) + lVar2;
  lVar2 = luaL_optinteger(L,3,-1);
  sVar5 = (lVar2 >> 0x3f & local_28 + 1) + lVar2;
  sVar4 = 0;
  if (0 < (long)sVar5) {
    sVar4 = sVar5;
  }
  lVar3 = 1;
  if (1 < lVar6) {
    lVar3 = lVar6;
  }
  if ((long)local_28 <= (long)sVar4) {
    sVar4 = local_28;
  }
  if ((long)sVar4 < lVar3) {
    pcVar1 = "";
    sVar4 = 0;
  }
  else {
    pcVar1 = pcVar1 + lVar3 + -1;
    sVar4 = (sVar4 - lVar3) + 1;
  }
  lua_pushlstring(L,pcVar1,sVar4);
  return 1;
}

Assistant:

static int str_sub (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  ptrdiff_t start = posrelat(luaL_checkinteger(L, 2), l);
  ptrdiff_t end = posrelat(luaL_optinteger(L, 3, -1), l);
  if (start < 1) start = 1;
  if (end > (ptrdiff_t)l) end = (ptrdiff_t)l;
  if (start <= end)
    lua_pushlstring(L, s+start-1, end-start+1);
  else lua_pushliteral(L, "");
  return 1;
}